

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

void load_input_model(vw *all,io_buf *io_temp)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  long *in_RSI;
  long in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000000f0;
  string *in_stack_000000f8;
  vw *in_stack_00000100;
  undefined8 in_stack_ffffffffffffff60;
  undefined2 uVar4;
  io_buf *in_stack_ffffffffffffff68;
  learner<char,_char> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_78 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  string local_30 [32];
  long *local_10;
  long local_8;
  
  uVar4 = (undefined2)((ulong)in_stack_ffffffffffffff60 >> 0x30);
  local_10 = in_RSI;
  local_8 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) &&
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_8 + 0x290)), sVar3 != 0)) {
    in_stack_ffffffffffffff68 = (io_buf *)(local_8 + 0x2a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_8 + 0x290),0);
    _Var1 = std::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (_Var1) {
      LEARNER::learner<char,_char>::save_load
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,SUB21((ushort)uVar4 >> 8,0),
                 SUB21(uVar4,0));
      (**(code **)(*local_10 + 0x40))();
      std::__cxx11::string::string(local_30,(string *)(local_8 + 0x2a8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      parse_mask_regressor_args(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff70);
      std::__cxx11::string::~string(local_30);
      return;
    }
  }
  std::__cxx11::string::string(local_78,(string *)(local_8 + 0x2a8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  parse_mask_regressor_args(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff70);
  std::__cxx11::string::~string(local_78);
  LEARNER::learner<char,_char>::save_load
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,SUB21((ushort)uVar4 >> 8,0),
             SUB21(uVar4,0));
  (**(code **)(*local_10 + 0x40))();
  return;
}

Assistant:

void load_input_model(vw& all, io_buf& io_temp)
{
  // Need to see if we have to load feature mask first or second.
  // -i and -mask are from same file, load -i file first so mask can use it
  if (!all.feature_mask.empty() && all.initial_regressors.size() > 0 && all.feature_mask == all.initial_regressors[0])
  {
    // load rest of regressor
    all.l->save_load(io_temp, true, false);
    io_temp.close_file();

    parse_mask_regressor_args(all, all.feature_mask, all.initial_regressors);
  }
  else
  {  // load mask first
    parse_mask_regressor_args(all, all.feature_mask, all.initial_regressors);

    // load rest of regressor
    all.l->save_load(io_temp, true, false);
    io_temp.close_file();
  }
}